

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

Result_Type
chaiscript::detail::
Cast_Helper_Inner<std::shared_ptr<const_chaiscript::exception::arithmetic_error>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  __pthread_list_t *this;
  Type_Conversions *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<chaiscript::exception::arithmetic_error> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Result_Type RVar5;
  
  pTVar1 = (param_2->m_conversions)._M_data;
  this = &(pTVar1->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list;
  if (((pTVar1->m_mutex).super_mutex.super___mutex_base._M_mutex.__size[0x10] & 1U) == 0) {
    psVar3 = Any::cast<std::shared_ptr<chaiscript::exception::arithmetic_error>>((Any *)this);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    psVar3 = (shared_ptr<chaiscript::exception::arithmetic_error> *)
             Any::cast<std::shared_ptr<chaiscript::exception::arithmetic_error_const>>((Any *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (psVar3->
         super___shared_ptr<chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  p_Var2 = (psVar3->
           super___shared_ptr<chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar5.
  super___shared_ptr<const_chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  RVar5.
  super___shared_ptr<const_chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ob;
  return (Result_Type)
         RVar5.
         super___shared_ptr<const_chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const())
          {
            return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result> >());
          } else {
            return ob.get().cast<std::shared_ptr<const Result> >();
          }
        }